

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnGlobalSet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  bool bVar4;
  Var *__s;
  GlobalType global_type;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x1f,loc);
  global_type.type.enum_ = Any;
  global_type.type.type_index_ = 0;
  global_type.mutable_ = true;
  Var::Var(&local_78,global_var);
  __s = &local_78;
  RVar2 = CheckGlobalIndex(this,&local_78,&global_type);
  bVar4 = RVar2.enum_ == Error || RVar1.enum_ == Error;
  Var::~Var(&local_78);
  if (global_type.mutable_ == false) {
    pcVar3 = Var::index(global_var,(char *)__s,__c);
    RVar1 = PrintError(this,loc,"can\'t global.set on immutable global at index %u.",
                       (ulong)pcVar3 & 0xffffffff);
    bVar4 = bVar4 || RVar1.enum_ == Error;
  }
  RVar1 = TypeChecker::OnGlobalSet(&this->typechecker_,global_type.type);
  RVar1.enum_._0_1_ = RVar1.enum_ == Error | bVar4;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnGlobalSet(const Location& loc, Var global_var) {
  Result result = CheckInstr(Opcode::GlobalSet, loc);
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  if (!global_type.mutable_) {
    result |= PrintError(
        loc, "can't global.set on immutable global at index %" PRIindex ".",
        global_var.index());
  }
  result |= typechecker_.OnGlobalSet(global_type.type);
  return result;
}